

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::FillScopeObject
              (JavascriptFunction *funcCallee,uint32 actualsCount,uint32 formalsCount,Var frameObj,
              Var *paramAddr,PropertyIdArray *propIds,HeapArgumentsObject *argsObj,
              ScriptContext *scriptContext,bool nonSimpleParamList,bool useCachedScope)

{
  DynamicTypeHandler *newTypeHandler;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  DynamicObject *pDVar6;
  JavascriptGeneratorFunction *pJVar7;
  FunctionBody *pFVar8;
  DynamicType *pDVar9;
  DynamicObject *extraout_RAX;
  undefined7 uVar12;
  Var pvVar10;
  undefined8 extraout_RAX_00;
  Var extraout_RAX_01;
  ES5HeapArgumentsObject *pEVar11;
  PropertyAttributes extraAttributes;
  Type *pTVar13;
  Var *ppvVar14;
  Type TVar15;
  uint uVar16;
  GeneratorVirtualScriptFunction *this;
  ulong uVar17;
  
  if (frameObj == (Var)0x0 && formalsCount != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1d31,"(formalsCount == 0 || frameObj != nullptr)",
                                "formalsCount == 0 || frameObj != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if (formalsCount == 0) goto LAB_00ac78cd;
  if (useCachedScope) {
    pDVar6 = VarTo<Js::DynamicObject>(frameObj);
    frameObj = pDVar6;
  }
  else {
    if (nonSimpleParamList) {
      bVar2 = VarIsImpl<Js::JavascriptGeneratorFunction>((RecyclableObject *)funcCallee);
      this = (GeneratorVirtualScriptFunction *)funcCallee;
      if (bVar2) {
        pJVar7 = UnsafeVarTo<Js::JavascriptGeneratorFunction,Js::JavascriptFunction>(funcCallee);
        this = (pJVar7->scriptFunction).ptr;
      }
      pFVar8 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
      pDVar9 = *(DynamicType **)((long)frameObj + 8);
      if ((pFVar8->field_0x17b & 2) == 0) {
        extraAttributes = 'G';
        goto LAB_00ac7784;
      }
      pDVar9 = PathTypeHandlerBase::CreateNewScopeObject<true>
                         (scriptContext,pDVar9,propIds,'G',0xffffffff);
    }
    else {
      pDVar9 = *(DynamicType **)((long)frameObj + 8);
      extraAttributes = '\0';
LAB_00ac7784:
      pDVar9 = PathTypeHandlerBase::CreateNewScopeObject<false>
                         (scriptContext,pDVar9,propIds,extraAttributes,0xffffffff);
    }
    newTypeHandler = (pDVar9->typeHandler).ptr;
    DynamicObject::EnsureSlots
              ((DynamicObject *)frameObj,
               *(int *)(*(long *)(*(long *)((long)frameObj + 8) + 0x28) + 0xc),
               newTypeHandler->slotCapacity,scriptContext,newTypeHandler);
    DynamicObject::ReplaceType((DynamicObject *)frameObj,pDVar9);
    pDVar6 = extraout_RAX;
  }
  uVar12 = (undefined7)((ulong)pDVar6 >> 8);
  if (argsObj != (HeapArgumentsObject *)0x0 && nonSimpleParamList) {
    pvVar10 = ConvertToUnmappedArguments
                        (argsObj,actualsCount,paramAddr,(DynamicObject *)frameObj,propIds,
                         formalsCount,scriptContext);
  }
  else {
    if (actualsCount == 0) {
      bVar2 = true;
      uVar17 = 0;
    }
    else {
      uVar17 = 0;
      do {
        if (propIds == (PropertyIdArray *)0x0) {
          TVar15 = 0xffffffff;
        }
        else {
          TVar15 = (&propIds[1].count)[uVar17];
        }
        DynamicObject::SetSlot((DynamicObject *)frameObj,TVar15,false,(int)uVar17,paramAddr[uVar17])
        ;
        uVar17 = uVar17 + 1;
        bVar2 = uVar17 < formalsCount;
        uVar12 = (undefined7)((ulong)extraout_RAX_00 >> 8);
      } while ((bVar2) && (uVar17 < actualsCount));
    }
    bVar3 = bVar2 ^ 1U | formalsCount <= (uint)uVar17;
    pvVar10 = (Var)CONCAT71(uVar12,bVar3);
    if (bVar3 == 0) {
      pTVar13 = &propIds[1].count + (uVar17 & 0xffffffff);
      do {
        if (propIds == (PropertyIdArray *)0x0) {
          TVar15 = 0xffffffff;
        }
        else {
          TVar15 = *pTVar13;
        }
        DynamicObject::SetSlot
                  ((DynamicObject *)frameObj,TVar15,false,(int)uVar17,
                   (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).undefinedValue.ptr);
        uVar16 = (int)uVar17 + 1;
        uVar17 = (ulong)uVar16;
        pTVar13 = pTVar13 + 1;
        pvVar10 = extraout_RAX_01;
      } while (formalsCount != uVar16);
    }
  }
  if (argsObj != (HeapArgumentsObject *)0x0 && nonSimpleParamList) {
    return pvVar10;
  }
LAB_00ac78cd:
  if (argsObj != (HeapArgumentsObject *)0x0) {
    if (formalsCount < actualsCount) {
      ppvVar14 = paramAddr + formalsCount;
      do {
        SetItem(argsObj,(RecyclableObject *)argsObj,formalsCount,*ppvVar14,scriptContext,
                PropertyOperation_None,1);
        formalsCount = formalsCount + 1;
        ppvVar14 = ppvVar14 + 1;
      } while (actualsCount != formalsCount);
    }
    BVar4 = JavascriptFunction::IsStrictMode(funcCallee);
    if (BVar4 != 0) {
      pEVar11 = HeapArgumentsObject::ConvertToUnmappedArgumentsObject(argsObj,!nonSimpleParamList);
      return pEVar11;
    }
  }
  return argsObj;
}

Assistant:

Var JavascriptOperators::FillScopeObject(JavascriptFunction *funcCallee, uint32 actualsCount, uint32 formalsCount, Var frameObj, Var * paramAddr,
        Js::PropertyIdArray *propIds, HeapArgumentsObject * argsObj, ScriptContext * scriptContext, bool nonSimpleParamList, bool useCachedScope)
    {
        Assert(formalsCount == 0 || frameObj != nullptr);

        // Transfer formal arguments (that were actually passed) from their ArgIn slots to the local frame object.
        uint32 i;

        Var *tmpAddr = paramAddr;

        if (formalsCount != 0)
        {
            DynamicObject* frameObject = nullptr;
            if (useCachedScope)
            {
                frameObject = VarTo<DynamicObject>(frameObj);
                __analysis_assume((uint32)frameObject->GetDynamicType()->GetTypeHandler()->GetSlotCapacity() >= formalsCount);
            }
            else
            {
                frameObject = (DynamicObject*)frameObj;
                // No fixed fields for formal parameters of the arguments object.  Also, mark all fields as initialized up-front, because
                // we will set them directly using SetSlot below, so the type handler will not have a chance to mark them as initialized later.
                // CONSIDER : When we delay type sharing until the second instance is created, pass an argument indicating we want the types
                // and handlers created here to be marked as shared up-front. This is to ensure we don't get any fixed fields and that the handler
                // is ready for storing values directly to slots.
                DynamicType* newType = nullptr;
                if (nonSimpleParamList)
                {
                    bool skipLetAttrForArguments = ( VarIs<JavascriptGeneratorFunction>(funcCallee) ?
                        UnsafeVarTo<JavascriptGeneratorFunction>(funcCallee)->GetGeneratorVirtualScriptFunction()->GetFunctionBody()->HasReferenceableBuiltInArguments()
                        : funcCallee->GetFunctionBody()->HasReferenceableBuiltInArguments());

                    if (skipLetAttrForArguments)
                    {
                        newType = PathTypeHandlerBase::CreateNewScopeObject<true>(scriptContext, frameObject->GetDynamicType(), propIds, PropertyLetDefaults);
                    }
                    else
                    {
                        newType = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, frameObject->GetDynamicType(), propIds, PropertyLetDefaults);
                    }
                }
                else
                {
                    newType = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, frameObject->GetDynamicType(), propIds);
                }
                int oldSlotCapacity = frameObject->GetDynamicType()->GetTypeHandler()->GetSlotCapacity();
                int newSlotCapacity = newType->GetTypeHandler()->GetSlotCapacity();
                __analysis_assume((uint32)newSlotCapacity >= formalsCount);

                frameObject->EnsureSlots(oldSlotCapacity, newSlotCapacity, scriptContext, newType->GetTypeHandler());
                frameObject->ReplaceType(newType);
            }

            if (argsObj && nonSimpleParamList)
            {
                return ConvertToUnmappedArguments(argsObj, actualsCount, paramAddr, frameObject, propIds, formalsCount, scriptContext);
            }

            for (i = 0; i < formalsCount && i < actualsCount; i++, tmpAddr++)
            {
                frameObject->SetSlot(SetSlotArguments(propIds != nullptr? propIds->elements[i] : Constants::NoProperty, i, *tmpAddr));
            }

            if (i < formalsCount)
            {
                // The formals that weren't passed still need to be put in the frame object so that
                // their names will be found. Initialize them to "undefined".
                for (; i < formalsCount; i++)
                {
                    frameObject->SetSlot(SetSlotArguments(propIds != nullptr? propIds->elements[i] : Constants::NoProperty, i, scriptContext->GetLibrary()->GetUndefined()));
                }
            }
        }

        if (argsObj != nullptr)
        {
            // Transfer the unnamed actual arguments, if any, to the Arguments object itself.
            for (i = formalsCount, tmpAddr = paramAddr + i; i < actualsCount; i++, tmpAddr++)
            {
                // ES5 10.6.11: use [[DefineOwnProperty]] semantics (instead of [[Put]]):
                // do not check whether property is non-writable/etc in the prototype.
                // ES3 semantics is same.
                JavascriptOperators::SetItem(argsObj, argsObj, i, *tmpAddr, scriptContext, PropertyOperation_None, /* skipPrototypeCheck = */ TRUE);
            }

            if (funcCallee->IsStrictMode())
            {
                // If the formals are let decls, then we just overwrote the frame object slots with
                // Undecl sentinels, and we can use the original arguments that were passed to the HeapArgumentsObject.
                return argsObj->ConvertToUnmappedArgumentsObject(!nonSimpleParamList);
            }
        }
        return argsObj;
    }